

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_compression_store.c
# Opt level: O1

void test_write_format_zip_compression_store(void)

{
  ushort uVar1;
  tm *ptVar2;
  size_t sVar3;
  undefined1 *puVar4;
  int iVar5;
  archive *paVar6;
  archive_entry *paVar7;
  ssize_t sVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  uchar *p_1;
  byte *buff_00;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  undefined1 *_v1;
  uchar *p;
  byte *buff_01;
  time_t t;
  char file_name [5];
  char folder_name [8];
  char file_data2 [5];
  char file_data1 [5];
  size_t used;
  char buff [100000];
  time_t tStack_18750;
  char acStack_18748 [8];
  archive_entry *paStack_18740;
  archive *paStack_18738;
  tm *ptStack_18730;
  char acStack_18728 [8];
  undefined4 uStack_18720;
  undefined1 uStack_1871c;
  byte abStack_18718 [8];
  size_t sStack_18710;
  void *pvStack_18708;
  undefined1 *puStack_18700;
  ulong uStack_186f8;
  undefined8 uStack_186f0;
  undefined1 auStack_186e8 [8];
  undefined8 uStack_186e0;
  undefined1 auStack_186d8 [4];
  ushort uStack_186d4;
  ushort uStack_186d2;
  ushort uStack_186d0;
  ushort uStack_186ce;
  ushort uStack_186cc;
  int iStack_186ca;
  int iStack_186c6;
  int iStack_186c2;
  ushort uStack_186be;
  ushort uStack_186bc;
  ushort auStack_186ba [2];
  undefined1 auStack_186b6 [2];
  ushort uStack_186b4;
  undefined1 auStack_186b2 [2];
  ushort uStack_186b0;
  char acStack_186ae [2];
  undefined1 auStack_186ac [4];
  undefined4 uStack_186a8;
  int iStack_186a4;
  undefined1 auStack_186a0 [99952];
  
  builtin_strncpy(acStack_18748,"file",5);
  buff_01 = abStack_18718;
  abStack_18718[4] = 0x35;
  abStack_18718[0] = 0x31;
  abStack_18718[1] = 0x32;
  abStack_18718[2] = 0x33;
  abStack_18718[3] = 0x34;
  buff_00 = (byte *)&uStack_18720;
  uStack_1871c = 0x30;
  uStack_18720 = 0x39383736;
  builtin_strncpy(acStack_18728,"folder/",8);
  uVar14 = 0;
  tStack_18750 = time((time_t *)0x0);
  ptStack_18730 = localtime(&tStack_18750);
  paVar6 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'c',(uint)(paVar6 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar5 = archive_write_set_format_zip(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'd',0,"ARCHIVE_OK",(long)iVar5,"archive_write_set_format_zip(a)",paVar6);
  iVar5 = archive_write_set_options(paVar6,"zip:compression=store");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'f',0,"ARCHIVE_OK",(long)iVar5,
                      "archive_write_set_options(a, \"zip:compression=store\")",paVar6);
  iVar5 = archive_write_set_options(paVar6,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'h',0,"ARCHIVE_OK",(long)iVar5,
                      "archive_write_set_options(a, \"zip:experimental\")",paVar6);
  iVar5 = archive_write_add_filter_none(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'i',0,"ARCHIVE_OK",(long)iVar5,"archive_write_add_filter_none(a)",paVar6);
  iVar5 = archive_write_set_bytes_per_block(paVar6,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'j',0,"ARCHIVE_OK",(long)iVar5,"archive_write_set_bytes_per_block(a, 1)",
                      paVar6);
  iVar5 = archive_write_set_bytes_in_last_block(paVar6,1);
  paStack_18738 = paVar6;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'k',0,"ARCHIVE_OK",(long)iVar5,"archive_write_set_bytes_in_last_block(a, 1)"
                      ,paVar6);
  iVar5 = archive_write_open_memory(paVar6,auStack_186d8,100000,&sStack_18710);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'l',0,"ARCHIVE_OK",(long)iVar5,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar6);
  paVar7 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'q',(uint)(paVar7 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname(paVar7,acStack_18748);
  archive_entry_set_mode(paVar7,0x81a4);
  archive_entry_set_size(paVar7,10);
  archive_entry_set_uid(paVar7,10);
  archive_entry_set_gid(paVar7,0x14);
  archive_entry_set_mtime(paVar7,tStack_18750,0);
  paStack_18740 = paVar7;
  archive_entry_set_atime(paVar7,tStack_18750 + 3,0);
  paVar6 = paStack_18738;
  iVar5 = archive_write_header(paStack_18738,paVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'y',0,"0",(long)iVar5,"archive_write_header(a, entry)",paVar6);
  lVar15 = 5;
  sVar8 = archive_write_data(paVar6,buff_01,5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'z',5,"sizeof(file_data1)",sVar8,
                      "archive_write_data(a, file_data1, sizeof(file_data1))",paVar6);
  sVar8 = archive_write_data(paVar6,buff_00,5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'{',5,"sizeof(file_data2)",sVar8,
                      "archive_write_data(a, file_data2, sizeof(file_data2))",paVar6);
  archive_entry_free(paStack_18740);
  paVar7 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'\x7f',(uint)(paVar7 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname(paVar7,acStack_18728);
  archive_entry_set_mode(paVar7,0x41ed);
  archive_entry_set_size(paVar7,0);
  archive_entry_set_uid(paVar7,0x1e);
  archive_entry_set_gid(paVar7,0x28);
  paStack_18740 = paVar7;
  archive_entry_set_mtime(paVar7,tStack_18750,0);
  archive_entry_set_ctime(paVar7,tStack_18750 + 5,0);
  paVar6 = paStack_18738;
  iVar5 = archive_write_header(paStack_18738,paStack_18740);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x87',0,"0",(long)iVar5,"archive_write_header(a, entry)",paVar6);
  archive_entry_free(paStack_18740);
  iVar5 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x8b',0,"ARCHIVE_OK",(long)iVar5,"archive_write_close(a)",paVar6);
  iVar5 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x8c',0,"ARCHIVE_OK",(long)iVar5,"archive_write_free(a)",(void *)0x0);
  dumpfile("constructed.zip",auStack_186d8,sStack_18710);
  sVar3 = sStack_18710;
  lVar11 = sStack_18710 + 2;
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x97',(void *)((long)&uStack_186f0 + lVar11),"p","PK\x05\x06",
                      "\"PK\\005\\006\"",4,"4",(void *)0x0);
  failure("This must be disk 0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x99',(ulong)*(ushort *)((long)&uStack_186f0 + sVar3 + 6),"i2(p + 4)",0,"0"
                      ,(void *)0x0);
  failure("Central dir must start on disk 0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x9b',(ulong)*(ushort *)(auStack_186e8 + sVar3),"i2(p + 6)",0,"0",
                      (void *)0x0);
  failure("All central dir entries are on this disk");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\x9d',(ulong)*(ushort *)(auStack_186e8 + sVar3 + 2),"i2(p + 8)",
                      (ulong)*(ushort *)(auStack_186e8 + sVar3 + 4),"i2(p + 10)",(void *)0x0);
  failure("CD start (%d) + CD length (%d) should == archive size - 22",
          (ulong)*(uint *)(auStack_186e8 + sVar3 + 6),(ulong)*(uint *)(auStack_186d8 + (sVar3 - 6)))
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'\xa0',(long)(*(int *)(auStack_186d8 + (sVar3 - 6)) +
                                     *(int *)(auStack_186e8 + sVar3 + 6)),"i4(p + 12) + i4(p + 16)",
                      sStack_18710 - 0x16,"used - 22",(void *)0x0);
  failure("no zip comment");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¢',(ulong)*(ushort *)(auStack_186d8 + (sVar3 - 2)),"i2(p + 20)",0,"0",
                      (void *)0x0);
  paStack_18738 = (archive *)(auStack_186d8 + *(int *)(auStack_186d8 + (sVar3 - 6)));
  failure("Central file record at offset %d should begin with PK\\001\\002 signature",
          (ulong)*(uint *)(auStack_186e8 + sVar3 + 6));
  paVar6 = paStack_18738;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'«',paStack_18738,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¬',(ulong)*(ushort *)((long)paVar6 + 4),"i2(p + 4)",0x30a,"3 * 256 + 10",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'­',(ulong)*(ushort *)((long)paVar6 + 6),"i2(p + 6)",10,"10",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'®',(ulong)*(ushort *)((long)paVar6 + 8),"i2(p + 8)",8,"8",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¯',(ulong)*(ushort *)((long)paVar6 + 10),"i2(p + 10)",0,"0",(void *)0x0);
  ptVar2 = ptStack_18730;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'°',(ulong)*(ushort *)((long)paVar6 + 0xc),"i2(p + 12)",
                      (long)(ptStack_18730->tm_sec / 2 +
                            ptStack_18730->tm_min * 0x20 + ptStack_18730->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'±',(ulong)*(ushort *)((long)paStack_18738 + 0xe),"i2(p + 14)",
                      (long)(ptVar2->tm_mon * 0x20 + ptVar2->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar2->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  paVar6 = paStack_18738;
  do {
    uVar14 = uVar14 ^ *buff_01;
    uVar10 = 9;
    do {
      uVar12 = uVar14 >> 1 ^ 0xedb88320;
      if ((uVar14 & 1) != 0) {
        uVar12 = uVar14 >> 1;
      }
      uVar14 = uVar12 ^ 0x80000000;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
    buff_01 = buff_01 + 1;
    lVar15 = lVar15 + -1;
  } while (lVar15 != 0);
  lVar11 = 5;
  do {
    uVar14 = uVar14 ^ *buff_00;
    uVar10 = 9;
    do {
      uVar12 = uVar14 >> 1 ^ 0xedb88320;
      if ((uVar14 & 1) != 0) {
        uVar12 = uVar14 >> 1;
      }
      uVar14 = uVar12 ^ 0x80000000;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
    buff_00 = buff_00 + 1;
    lVar11 = lVar11 + -1;
  } while (lVar11 != 0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'´',(long)*(int *)((long)paStack_18738 + 0x10),"i4(p + 16)",uVar14,"crc",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'µ',(long)*(int *)((long)paVar6 + 0x14),"i4(p + 20)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¶',(long)*(int *)((long)paVar6 + 0x18),"i4(p + 24)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  uVar1 = *(ushort *)((long)paVar6 + 0x1c);
  sVar9 = strlen(acStack_18748);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'·',(ulong)uVar1,"i2(p + 28)",sVar9,"strlen(file_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¸',(ulong)*(ushort *)((long)paVar6 + 0x1e),"i2(p + 30)",0x1c,"28",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¹',(ulong)*(ushort *)((long)paVar6 + 0x20),"i2(p + 32)",0,"0",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'º',(ulong)*(ushort *)((long)paVar6 + 0x22),"i2(p + 34)",0,"0",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'»',(ulong)*(ushort *)((long)paVar6 + 0x24),"i2(p + 36)",0,"0",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¼',(ulong)((*(byte *)((long)paVar6 + 0x29) & 3) << 8) |
                             (ulong)*(byte *)((long)paVar6 + 0x28),"i4(p + 38) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'½',(long)*(int *)((long)paVar6 + 0x2a),"i4(p + 42)",0,"0",(void *)0x0);
  sVar9 = strlen(acStack_18748);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'¾',(undefined1 *)((long)paVar6 + 0x2e),"p + 46",acStack_18748,"file_name",
                      sVar9,"strlen(file_name)",(void *)0x0);
  sVar9 = strlen(acStack_18748);
  lVar11 = sVar9 + 0x2e;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'À',(ulong)*(ushort *)((long)paVar6 + sVar9 + 0x2e),"i2(p)",0x5455,"0x5455"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Á',(ulong)*(ushort *)((long)paVar6 + sVar9 + 0x30),"i2(p + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Â',(long)*(char *)((long)paVar6 + sVar9 + 0x32),"p[4]",3,"3",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ã',(long)*(int *)((long)paVar6 + sVar9 + 0x33),"i4(p + 5)",tStack_18750,
                      "t",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ä',(long)*(int *)((long)paVar6 + sVar9 + 0x37),"i4(p + 9)",
                      tStack_18750 + 3,"t + 3",(void *)0x0);
  uVar12 = (ulong)*(ushort *)((long)paVar6 + sVar9 + 0x30);
  uStack_186f0 = (undefined1 *)((long)paVar6 + uVar12 + lVar11 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Æ',(ulong)*(ushort *)((long)paVar6 + uVar12 + 4 + lVar11),"i2(p)",0x7875,
                      "0x7875",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ç',(ulong)*(ushort *)((long)paVar6 + uVar12 + 6 + lVar11),"i2(p + 2)",0xb,
                      "11",(void *)0x0);
  uStack_186f8 = (ulong)*(ushort *)((long)paVar6 + uVar12 + 6 + lVar11);
  paStack_18738 = (archive *)((undefined1 *)((long)paVar6 + uVar12 + lVar11 + 4) + uStack_186f8);
  puStack_18700 = (undefined1 *)((long)paStack_18738 + 4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Í',auStack_186d8,"q","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Î',(ulong)uStack_186d4,"i2(q + 4)",10,"10",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ï',(ulong)uStack_186d2,"i2(q + 6)",8,"8",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ð',(ulong)uStack_186d0,"i2(q + 8)",0,"0",(void *)0x0);
  ptVar2 = ptStack_18730;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ñ',(ulong)uStack_186ce,"i2(q + 10)",
                      (long)(ptStack_18730->tm_sec / 2 +
                            ptStack_18730->tm_min * 0x20 + ptStack_18730->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ò',(ulong)uStack_186cc,"i2(q + 12)",
                      (long)(ptVar2->tm_mon * 0x20 + ptVar2->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar2->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ó',(long)iStack_186ca,"i4(q + 14)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ô',(long)iStack_186c6,"i4(q + 18)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Õ',(long)iStack_186c2,"i4(q + 22)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  sVar9 = strlen(acStack_18748);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ö',(ulong)uStack_186be,"i2(q + 26)",sVar9,"strlen(file_name)",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'×',(ulong)uStack_186bc,"i2(q + 28)",0x29,"41",(void *)0x0);
  sVar9 = strlen(acStack_18748);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ø',auStack_186ba,"q + 30",acStack_18748,"file_name",sVar9,
                      "strlen(file_name)",(void *)0x0);
  sVar9 = strlen(acStack_18748);
  lVar15 = (long)auStack_186ba + sVar9;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ú',(ulong)*(ushort *)((long)auStack_186ba + sVar9),"i2(q)",0x5455,"0x5455"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Û',(ulong)*(ushort *)((long)auStack_186ba + sVar9 + 2),"i2(q + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ü',(long)*(char *)((long)auStack_186ba + sVar9 + 4),"q[4]",3,"3",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ý',(long)*(int *)((long)auStack_186ba + sVar9 + 5),"i4(q + 5)",
                      tStack_18750,"t",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Þ',(long)*(int *)((long)auStack_186ba + sVar9 + 9),"i4(q + 9)",
                      tStack_18750 + 3,"t + 3",(void *)0x0);
  uVar12 = (ulong)*(ushort *)((long)auStack_186ba + sVar9 + 2);
  lVar11 = uVar12 + 4;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'á',(ulong)*(ushort *)(lVar15 + uVar12 + 4),"i2(q)",0x7875,"0x7875",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'â',(ulong)*(ushort *)(lVar15 + uVar12 + 6),"i2(q + 2)",0xb,"11",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ã',(long)*(char *)(lVar15 + uVar12 + 8),"q[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ä',(long)*(char *)(lVar15 + uVar12 + 9),"q[5]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'å',(long)*(int *)(lVar15 + uVar12 + 10),"i4(q + 6)",10,"file_uid",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'æ',(long)*(char *)(lVar15 + uVar12 + 0xe),"q[10]",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ç',(long)*(int *)(lVar15 + uVar12 + 0xf),"i4(q + 11)",0x14,"file_gid",
                      (void *)0x0);
  uVar12 = (ulong)*(ushort *)(lVar15 + uVar12 + 6);
  paStack_18740 = (archive_entry *)(lVar15 + uVar12 + lVar11 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ê',(ulong)*(ushort *)(lVar15 + uVar12 + 4 + lVar11),"i2(q)",0x6c65,
                      "0x6c65",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ë',(ulong)*(ushort *)(lVar15 + uVar12 + 6 + lVar11),"i2(q + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ì',(long)*(char *)(lVar15 + uVar12 + 8 + lVar11),"q[4]",7,"7",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'í',(ulong)*(byte *)(lVar15 + uVar12 + 10 + lVar11),"i2(q + 5) >> 8",3,"3",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'î',(ulong)*(ushort *)(lVar15 + uVar12 + 0xb + lVar11),"i2(q + 7)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ï',(ulong)((*(byte *)(lVar15 + uVar12 + 0x10 + lVar11) & 3) << 8) |
                             (ulong)*(byte *)(lVar15 + uVar12 + 0xf + lVar11),
                      "i4(q + 9) >> 16 & 01777",0x1a4,"file_perm",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'ò',(uint)((long)paStack_18740 +
                                 (ulong)*(ushort *)(lVar15 + uVar12 + 6 + lVar11) + 4 ==
                                lVar15 + (ulong)uStack_186bc),
                   "q == extra_start + i2(local_header + 28)",(void *)0x0);
  uVar12 = (ulong)uStack_186bc;
  pvVar13 = (void *)(lVar15 + uVar12);
  paStack_18740 = (archive_entry *)pvVar13;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ö',pvVar13,"q",abStack_18718,"file_data1",5,"sizeof(file_data1)",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'÷',(void *)((long)pvVar13 + 5),"q + sizeof(file_data1)",&uStack_18720,
                      "file_data2",5,"sizeof(file_data2)",(void *)0x0);
  auStack_186e8 = (undefined1  [8])uVar12;
  uStack_186e0 = lVar15;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'û',(void *)(lVar15 + uVar12 + 10),"q","PK\a\b","\"PK\\007\\010\"",4,"4",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ü',(long)*(int *)(lVar15 + uVar12 + 0xe),"i4(q + 4)",uVar14,"crc",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ý',(long)*(int *)(lVar15 + uVar12 + 0x12),"i4(q + 8)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'þ',(long)*(int *)(lVar15 + uVar12 + 0x16),"i4(q + 12)",10,
                      "sizeof(file_data1) + sizeof(file_data2)",(void *)0x0);
  pvStack_18708 = (void *)(lVar15 + uVar12 + 0x1a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ă',puStack_18700,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  puVar4 = uStack_186f0;
  uVar14 = uStack_186f8;
  _v1 = uStack_186f0 + uStack_186f8 + 0x32;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ă',(ulong)*(ushort *)(uStack_186f0 + uStack_186f8 + 8),"i2(p + 4)",0x314,
                      "3 * 256 + 20",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ą',(ulong)*(ushort *)(puVar4 + uVar14 + 10),"i2(p + 6)",0x14,"20",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ą',(ulong)*(ushort *)(puVar4 + uVar14 + 0xc),"i2(p + 8)",0,"0",(void *)0x0
                     );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ć',(ulong)*(ushort *)(puVar4 + uVar14 + 0xe),"i2(p + 10)",0,"0",
                      (void *)0x0);
  ptVar2 = ptStack_18730;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ć',(ulong)*(ushort *)(puVar4 + uVar14 + 0x10),"i2(p + 12)",
                      (long)(ptStack_18730->tm_sec / 2 +
                            ptStack_18730->tm_min * 0x20 + ptStack_18730->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĉ',(ulong)*(ushort *)(puVar4 + uVar14 + 0x12),"i2(p + 14)",
                      (long)(ptVar2->tm_mon * 0x20 + ptVar2->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar2->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ċ',(long)*(int *)(puVar4 + uVar14 + 0x14),"i4(p + 16)",0,"crc",(void *)0x0
                     );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ċ',(long)*(int *)(puVar4 + uVar14 + 0x18),"i4(p + 20)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Č',(long)*(int *)(puVar4 + uVar14 + 0x1c),"i4(p + 24)",0,"0",(void *)0x0);
  uVar1 = *(ushort *)(puVar4 + uVar14 + 0x20);
  sVar9 = strlen(acStack_18728);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'č',(ulong)uVar1,"i2(p + 28)",sVar9,"strlen(folder_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ď',(ulong)*(ushort *)(puVar4 + uVar14 + 0x22),"i2(p + 30)",0x1c,"28",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ď',(ulong)*(ushort *)(puVar4 + uVar14 + 0x24),"i2(p + 32)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Đ',(ulong)*(ushort *)(puVar4 + uVar14 + 0x26),"i2(p + 34)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'đ',(ulong)*(ushort *)(puVar4 + uVar14 + 0x28),"i2(p + 36)",0,"0",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ē',(ulong)(((byte)puVar4[uVar14 + 0x2d] & 3) << 8) |
                             (ulong)(byte)puVar4[uVar14 + 0x2c],"i4(p + 38) >> 16 & 01777",0x1ed,
                      "folder_perm",(void *)0x0);
  pvVar13 = pvStack_18708;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ē',(long)*(int *)(puVar4 + uVar14 + 0x2e),"i4(p + 42)",
                      (long)pvStack_18708 - (long)auStack_186d8,"q - buff",(void *)0x0);
  sVar9 = strlen(acStack_18728);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĕ',_v1,"p + 46",acStack_18728,"folder_name",sVar9,"strlen(folder_name)",
                      (void *)0x0);
  sVar9 = strlen(acStack_18728);
  paVar6 = paStack_18738;
  lVar11 = sVar9 + 0x32;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ė',(ulong)*(ushort *)((long)paStack_18738 + sVar9 + 0x32),"i2(p)",0x5455,
                      "0x5455",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ė',(ulong)*(ushort *)((long)paVar6 + sVar9 + 0x34),"i2(p + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ę',(long)*(char *)((long)paVar6 + sVar9 + 0x36),"p[4]",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ę',(long)*(int *)((long)paVar6 + sVar9 + 0x37),"i4(p + 5)",tStack_18750,
                      "t",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ě',(long)*(int *)((long)paVar6 + sVar9 + 0x3b),"i4(p + 9)",
                      tStack_18750 + 5,"t + 5",(void *)0x0);
  uVar14 = (ulong)*(ushort *)((long)paVar6 + sVar9 + 0x34);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĝ',(ulong)*(ushort *)((long)paVar6 + uVar14 + 4 + lVar11),"i2(p)",0x7875,
                      "0x7875",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĝ',(ulong)*(ushort *)((long)paVar6 + uVar14 + 6 + lVar11),"i2(p + 2)",0xb,
                      "11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ğ',(long)*(char *)((long)paVar6 + uVar14 + 8 + lVar11),"p[4]",1,"1",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ğ',(long)*(char *)((long)paVar6 + uVar14 + 9 + lVar11),"p[5]",4,"4",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ġ',(long)*(int *)((long)paVar6 + uVar14 + 10 + lVar11),"i4(p + 6)",0x1e,
                      "folder_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ġ',(long)*(char *)((long)paVar6 + uVar14 + 0xe + lVar11),"p[10]",4,"4",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ģ',(long)*(int *)((long)paVar6 + uVar14 + 0xf + lVar11),"i4(p + 11)",0x28,
                      "folder_gid",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ħ',pvVar13,"q","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĩ',(ulong)*(ushort *)((long)pvVar13 + 4),"i2(q + 4)",0x14,"20",(void *)0x0
                     );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĩ',(ulong)*(ushort *)((long)pvVar13 + 6),"i2(q + 6)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ī',(ulong)*(ushort *)((long)pvVar13 + 8),"i2(q + 8)",0,"0",(void *)0x0);
  ptVar2 = ptStack_18730;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ī',(ulong)*(ushort *)((long)pvVar13 + 10),"i2(q + 10)",
                      (long)(ptStack_18730->tm_sec / 2 +
                            ptStack_18730->tm_min * 0x20 + ptStack_18730->tm_hour * 0x800),
                      "(tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĭ',(ulong)*(ushort *)((long)pvVar13 + 0xc),"i2(q + 12)",
                      (long)(ptVar2->tm_mon * 0x20 + ptVar2->tm_year * 0x200 + -0x9fe0) +
                      (long)ptVar2->tm_mday,
                      "((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĭ',(long)*(int *)((long)pvVar13 + 0xe),"i4(q + 14)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Į',(long)*(int *)((long)pvVar13 + 0x12),"i4(q + 18)",0,"0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'į',(long)*(int *)((long)pvVar13 + 0x16),"i4(q + 22)",0,"0",(void *)0x0);
  uVar1 = *(ushort *)((long)pvVar13 + 0x1a);
  sVar9 = strlen(acStack_18728);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'İ',(ulong)uVar1,"i2(q + 26)",sVar9,"strlen(folder_name)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ı',(ulong)*(ushort *)((long)pvVar13 + 0x1c),"i2(q + 28)",0x29,"41",
                      (void *)0x0);
  pvVar13 = (void *)(uStack_186e0 + (long)auStack_186e8 + 0x38U);
  ptStack_18730 = (tm *)pvVar13;
  sVar9 = strlen(acStack_18728);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĳ',pvVar13,"q + 30",acStack_18728,"folder_name",sVar9,
                      "strlen(folder_name)",(void *)0x0);
  sVar9 = strlen(acStack_18728);
  paVar7 = paStack_18740;
  lVar11 = sVar9 + 0x38;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ĵ',(ulong)*(ushort *)((long)paStack_18740 + sVar9 + 0x38),"i2(q)",0x5455,
                      "0x5455",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĵ',(ulong)*(ushort *)((long)paVar7 + sVar9 + 0x3a),"i2(q + 2)",9,"9",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ķ',(long)*(char *)((long)paVar7 + sVar9 + 0x3c),"q[4]",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ķ',(long)*(int *)((long)paVar7 + sVar9 + 0x3d),"i4(q + 5)",tStack_18750,
                      "t",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĸ',(long)*(int *)((long)paVar7 + sVar9 + 0x41),"i4(q + 9)",
                      tStack_18750 + 5,"t + 5",(void *)0x0);
  uVar14 = (ulong)*(ushort *)((long)paVar7 + sVar9 + 0x3a);
  lVar15 = uVar14 + lVar11 + 4;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ĺ',(ulong)*(ushort *)((long)paVar7 + uVar14 + 4 + lVar11),"i2(q)",0x7875,
                      "0x7875",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ļ',(ulong)*(ushort *)((long)paVar7 + uVar14 + 6 + lVar11),"i2(q + 2)",0xb,
                      "11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ļ',(long)*(char *)((long)paVar7 + uVar14 + 8 + lVar11),"q[4]",1,"1",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ľ',(long)*(char *)((long)paVar7 + uVar14 + 9 + lVar11),"q[5]",4,"4",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ľ',(long)*(int *)((long)paVar7 + uVar14 + 10 + lVar11),"i4(q + 6)",0x1e,
                      "folder_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ŀ',(long)*(char *)((long)paVar7 + uVar14 + 0xe + lVar11),"q[10]",4,"4",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ŀ',(long)*(int *)((long)paVar7 + uVar14 + 0xf + lVar11),"i4(q + 11)",0x28,
                      "folder_gid",(void *)0x0);
  uVar14 = (ulong)*(ushort *)((long)paVar7 + uVar14 + 6 + lVar11);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ń',(ulong)*(ushort *)((long)paVar7 + uVar14 + 4 + lVar15),"i2(q)",0x6c65,
                      "0x6c65",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ń',(ulong)*(ushort *)((long)paVar7 + uVar14 + 6 + lVar15),"i2(q + 2)",9,
                      "9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ņ',(long)*(char *)((long)paVar7 + uVar14 + 8 + lVar15),"q[4]",7,"7",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ņ',(ulong)*(byte *)((long)paVar7 + uVar14 + 10 + lVar15),"i2(q + 5) >> 8",
                      3,"3",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ň',(ulong)*(ushort *)((long)paVar7 + uVar14 + 0xb + lVar15),"i2(q + 7)",0,
                      "0",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'ň',(ulong)((*(byte *)((long)paVar7 + uVar14 + 0x10 + lVar15) & 3) << 8) |
                             (ulong)*(byte *)((long)paVar7 + uVar14 + 0xf + lVar15),
                      "i4(q + 9) >> 16 & 01777",0x1ed,"folder_perm",(void *)0x0);
  ptVar2 = ptStack_18730;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                   ,L'ŋ',(uint)((long)paVar7 +
                                 (ulong)*(ushort *)((long)paVar7 + uVar14 + 6 + lVar15) +
                                 uVar14 + lVar15 + 8 ==
                                (long)paVar7 + (ulong)*(ushort *)((long)ptStack_18730 + -2) + lVar11
                                ),"q == extra_start + i2(local_header + 28)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_compression_store.c"
                      ,L'Ő',(void *)((long)paVar7 + (ulong)*(ushort *)((long)ptVar2 + -2) + lVar11)
                      ,"q","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_compression_store)
{
	/* Buffer data */
	struct archive *a;
	struct archive_entry *entry;
	char buff[100000];
	const char *buffend;
	/* p is the pointer to walk over the central directory,
	 * q walks over the local headers, the data and the data descriptors. */
	const char *p, *q, *local_header, *extra_start;
	size_t used;

	/* File data */
	char file_name[] = "file";
	char file_data1[] = {'1', '2', '3', '4', '5'};
	char file_data2[] = {'6', '7', '8', '9', '0'};
	int file_perm = 00644;
	short file_uid = 10;
	short file_gid = 20;

	/* Folder data */
	char folder_name[] = "folder/";
	int folder_perm = 00755;
	short folder_uid = 30;
	short folder_gid = 40;

	/* Time data */
	time_t t = time(NULL);
	struct tm *tm = localtime(&t);

	/* Misc variables */
	unsigned long crc;

	/* Create new ZIP archive in memory without padding. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:compression=store"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Write entries. */

	/* Regular file */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_pathname(entry, file_name);
	archive_entry_set_mode(entry, S_IFREG | 0644);
	archive_entry_set_size(entry, sizeof(file_data1) + sizeof(file_data2));
	archive_entry_set_uid(entry, file_uid);
	archive_entry_set_gid(entry, file_gid);
	archive_entry_set_mtime(entry, t, 0);
	archive_entry_set_atime(entry, t + 3, 0);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	assertEqualIntA(a, sizeof(file_data1), archive_write_data(a, file_data1, sizeof(file_data1)));
	assertEqualIntA(a, sizeof(file_data2), archive_write_data(a, file_data2, sizeof(file_data2)));
	archive_entry_free(entry);

	/* Folder */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_pathname(entry, folder_name);
	archive_entry_set_mode(entry, S_IFDIR | folder_perm);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, folder_uid);
	archive_entry_set_gid(entry, folder_gid);
	archive_entry_set_mtime(entry, t, 0);
	archive_entry_set_ctime(entry, t + 5, 0);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close the archive . */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	dumpfile("constructed.zip", buff, used);

	/* Remember the end of the archive in memory. */
	buffend = buff + used;

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2(p + 8), i2(p + 10));
	failure("CD start (%d) + CD length (%d) should == archive size - 22",
	    i4(p + 12), i4(p + 16));
	assertEqualInt(i4(p + 12) + i4(p + 16), used - 22);
	failure("no zip comment");
	assertEqualInt(i2(p + 20), 0);

	/* Get address of first entry in central directory. */
	p = buff + i4(buffend - 6);
	failure("Central file record at offset %d should begin with"
	    " PK\\001\\002 signature",
	    i4(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + 10); /* Version made by */
	assertEqualInt(i2(p + 6), 10); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 8); /* Flags */
	assertEqualInt(i2(p + 10), 0); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data1, sizeof(file_data1));
	crc = bitcrc32(crc, file_data2, sizeof(file_data2));
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4(p + 20), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(p + 24), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(p + 30), 28); /* Extra field length */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = p + 46 + strlen(file_name);
	assertEqualInt(i2(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 9); /* 'UT' size */
	assertEqualInt(p[4], 3); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(p + 9), t + 3); /* 'UT' atime */
	p = p + 4 + i2(p + 2);
	assertEqualInt(i2(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
/* TODO */
	p = p + 4 + i2(p + 2);

	/* Verify local header of file entry. */
	local_header = q = buff;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(q + 4), 10); /* Version needed to extract */
	assertEqualInt(i2(q + 6), 8); /* Flags */
	assertEqualInt(i2(q + 8), 0); /* Compression method */
	assertEqualInt(i2(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4(q + 18), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(q + 22), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	assertEqualInt(i2(q + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, file_name, strlen(file_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(file_name);
	assertEqualInt(i2(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 3); /* 'UT' flags */
	assertEqualInt(i4(q + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(q + 9), t + 3); /* 'UT' atime */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(q + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(q + 11), file_gid); /* 'Ux' GID */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x6c65); /* 'el' experimental extension header */
	assertEqualInt(i2(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* Bitmap of fields included. */
	assertEqualInt(i2(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4(q + 9) >> 16 & 01777, file_perm); /* external file attributes */
	q = q + 4 + i2(q + 2);

	assert(q == extra_start + i2(local_header + 28));
	q = extra_start + i2(local_header + 28);

	/* Verify data of file entry. */
	assertEqualMem(q, file_data1, sizeof(file_data1));
	assertEqualMem(q + sizeof(file_data1), file_data2, sizeof(file_data2));
	q = q + sizeof(file_data1) + sizeof(file_data2);

	/* Verify data descriptor of file entry. */
	assertEqualMem(q, "PK\007\010", 4); /* Signature */
	assertEqualInt(i4(q + 4), crc); /* CRC-32 */
	assertEqualInt(i4(q + 8), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(q + 12), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	q = q + 16;

	/* Verify folder entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + 20); /* Version made by */
	assertEqualInt(i2(p + 6), 20); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 0); /* Flags */
	assertEqualInt(i2(p + 10), 0); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = 0;
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4(p + 20), 0); /* Compressed size */
	assertEqualInt(i4(p + 24), 0); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2(p + 30), 28); /* Extra field length */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, folder_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), q - buff); /* Offset of local header */
	assertEqualMem(p + 46, folder_name, strlen(folder_name)); /* Pathname */
	p = p + 46 + strlen(folder_name);
	assertEqualInt(i2(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 9); /* 'UT' size */
	assertEqualInt(p[4], 5); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(p + 9), t + 5); /* 'UT' atime */
	p = p + 4 + i2(p + 2);
	assertEqualInt(i2(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(p + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(p + 11), folder_gid); /* 'ux' GID */
	/*p = p + 4 + i2(p + 2);*/

	/* Verify local header of folder entry. */
	local_header = q;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(q + 4), 20); /* Version needed to extract */
	assertEqualInt(i2(q + 6), 0); /* Flags */
	assertEqualInt(i2(q + 8), 0); /* Compression method */
	assertEqualInt(i2(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4(q + 18), 0); /* Compressed size */
	assertEqualInt(i4(q + 22), 0); /* Uncompressed size */
	assertEqualInt(i2(q + 26), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, folder_name, strlen(folder_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(folder_name);
	assertEqualInt(i2(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 5); /* 'UT' flags */
	assertEqualInt(i4(q + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(q + 9), t + 5); /* 'UT' atime */
	q = q + 4 + i2(q + 2);
	assertEqualInt(i2(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(q + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(q + 11), folder_gid); /* 'ux' GID */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x6c65); /* 'el' experimental extension header */
	assertEqualInt(i2(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* bitmap of fields */
	assertEqualInt(i2(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4(q + 9) >> 16 & 01777, folder_perm); /* external file attributes */
	q = q + 4 + i2(q + 2);

	assert(q == extra_start + i2(local_header + 28));
	q = extra_start + i2(local_header + 28);

	/* There should not be any data in the folder entry,
	 * so the first central directory entry should be next: */
	assertEqualMem(q, "PK\001\002", 4); /* Signature */
}